

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pkey.cc
# Opt level: O0

int PEM_write_PrivateKey
              (FILE *fp,EVP_PKEY *x,EVP_CIPHER *enc,uchar *kstr,int klen,undefined1 *cb,void *u)

{
  BIO *bp;
  int ret;
  BIO *b;
  pem_password_cb *cb_local;
  int pass_len_local;
  uchar *pass_local;
  EVP_CIPHER *enc_local;
  EVP_PKEY *x_local;
  FILE *fp_local;
  
  bp = BIO_new_fp(fp,0);
  if (bp == (BIO *)0x0) {
    ERR_put_error(9,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pkey.cc"
                  ,0x87);
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = PEM_write_bio_PrivateKey(bp,x,enc,kstr,klen,cb,u);
    BIO_free(bp);
  }
  return fp_local._4_4_;
}

Assistant:

int PEM_write_PrivateKey(FILE *fp, EVP_PKEY *x, const EVP_CIPHER *enc,
                         const unsigned char *pass, int pass_len,
                         pem_password_cb *cb, void *u) {
  BIO *b = BIO_new_fp(fp, BIO_NOCLOSE);
  if (b == NULL) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_BUF_LIB);
    return 0;
  }
  int ret = PEM_write_bio_PrivateKey(b, x, enc, pass, pass_len, cb, u);
  BIO_free(b);
  return ret;
}